

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptParser.cpp
# Opt level: O1

void __thiscall MiniScript::TestParser::TestValidParse(TestParser *this,String *src,bool dumpTac)

{
  long *plVar1;
  StringStorage *pSVar2;
  Parser parser;
  String local_c0;
  Parser local_b0;
  
  Parser::Parser(&local_b0);
  local_c0.isTemp = false;
  pSVar2 = src->ss;
  if (pSVar2 != (StringStorage *)0x0) {
    plVar1 = &(pSVar2->super_RefCountedStorage).refCount;
    *plVar1 = *plVar1 + 1;
  }
  local_c0.ss = pSVar2;
  Parser::Parse(&local_b0,&local_c0,false);
  if (pSVar2 != (StringStorage *)0x0) {
    plVar1 = &(pSVar2->super_RefCountedStorage).refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(pSVar2->super_RefCountedStorage)._vptr_RefCountedStorage[1])(pSVar2);
    }
    local_c0.ss = (StringStorage *)0x0;
  }
  Parser::~Parser(&local_b0);
  return;
}

Assistant:

void TestParser::TestValidParse(String src, bool dumpTac) {
		Parser parser;
		try {
			parser.Parse(src);
		} catch (MiniscriptException& e) {
			std::cerr << e.Description().c_str() << " while parsing:" << std::endl;
			std::cerr << src.c_str() << std::endl;
		}
//		if (dumpTac && parser.output != null) TAC.Dump(parser.output.code);
	}